

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O0

void __thiscall GGSock::ClientData::ClientData(ClientData *this)

{
  long in_RDI;
  shared_ptr<GGSock::Communicator> *this_00;
  shared_ptr<GGSock::Communicator> *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  bool *in_stack_ffffffffffffffd8;
  
  FileServer::ClientInfo::ClientInfo
            ((ClientInfo *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
  *(undefined1 *)(in_RDI + 0x40) = 0;
  *(undefined1 *)(in_RDI + 0x41) = 0;
  *(undefined1 *)(in_RDI + 0x42) = 0;
  *(undefined1 *)(in_RDI + 0x43) = 0;
  std::
  deque<GGSock::FileServer::FileChunkRequestData,_std::allocator<GGSock::FileServer::FileChunkRequestData>_>
  ::deque((deque<GGSock::FileServer::FileChunkRequestData,_std::allocator<GGSock::FileServer::FileChunkRequestData>_>
           *)0x141183);
  this_00 = (shared_ptr<GGSock::Communicator> *)(in_RDI + 0x98);
  std::shared_ptr<GGSock::Communicator>::shared_ptr((shared_ptr<GGSock::Communicator> *)0x14119b);
  std::make_shared<GGSock::Communicator,bool>(in_stack_ffffffffffffffd8);
  std::shared_ptr<GGSock::Communicator>::operator=(this_00,in_stack_ffffffffffffffa8);
  std::shared_ptr<GGSock::Communicator>::~shared_ptr((shared_ptr<GGSock::Communicator> *)0x1411d1);
  return;
}

Assistant:

ClientData() {
        communicator = std::make_shared<Communicator>(false);
    }